

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetPipelineResourceFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_RESOURCE_FLAGS Flags,
          bool GetFullName,char *DelimiterString)

{
  char *pcVar1;
  ulong uVar2;
  Char *Message;
  undefined7 in_register_00000009;
  undefined1 local_58 [8];
  string msg;
  PIPELINE_RESOURCE_FLAGS Flag;
  allocator local_21;
  char *local_20;
  char *DelimiterString_local;
  bool GetFullName_local;
  String *pSStack_10;
  PIPELINE_RESOURCE_FLAGS Flags_local;
  String *Str;
  
  local_20 = (char *)CONCAT71(in_register_00000009,GetFullName);
  DelimiterString_local._7_1_ = (char)this;
  DelimiterString_local._6_1_ = Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS;
  pSStack_10 = __return_storage_ptr__;
  if (DelimiterString_local._7_1_ == '\0') {
    pcVar1 = "UNKNOWN";
    if (DelimiterString_local._6_1_ != PIPELINE_RESOURCE_FLAG_NONE) {
      pcVar1 = "PIPELINE_RESOURCE_FLAG_NONE";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    msg.field_2._M_local_buf[0xb] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while (DelimiterString_local._7_1_ != '\0') {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_20);
      }
      msg.field_2._M_local_buf[10] =
           ExtractLSB<Diligent::PIPELINE_RESOURCE_FLAGS>
                     ((PIPELINE_RESOURCE_FLAGS *)((long)&DelimiterString_local + 7));
      switch(msg.field_2._M_local_buf[10]) {
      case '\x01':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      case '\x02':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      default:
        FormatString<char[34]>
                  ((string *)local_58,(char (*) [34])"Unexpected pipeline resource flag");
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetPipelineResourceFlagsString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x680);
        std::__cxx11::string::~string((string *)local_58);
        break;
      case '\x04':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      case '\b':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      case '\x10':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetPipelineResourceFlagsString(PIPELINE_RESOURCE_FLAGS Flags, bool GetFullName /*= false*/, const char* DelimiterString /*= "|"*/)
{
    if (Flags == PIPELINE_RESOURCE_FLAG_NONE)
        return GetFullName ? "PIPELINE_RESOURCE_FLAG_NONE" : "UNKNOWN";
    String Str;
    while (Flags != PIPELINE_RESOURCE_FLAG_NONE)
    {
        if (!Str.empty())
            Str += DelimiterString;

        PIPELINE_RESOURCE_FLAGS Flag = ExtractLSB(Flags);

        static_assert(PIPELINE_RESOURCE_FLAG_LAST == (1u << 4), "Please update the switch below to handle the new pipeline resource flag.");
        switch (Flag)
        {
            case PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS" : "NO_DYNAMIC_BUFFERS");
                break;

            case PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER" : "COMBINED_SAMPLER");
                break;

            case PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER" : "FORMATTED_BUFFER");
                break;

            case PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY" : "RUNTIME_ARRAY");
                break;

            case PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT:
                Str.append(GetFullName ? "PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT" : "GENERAL_INPUT_ATTACHMENT");
                break;

            default:
                UNEXPECTED("Unexpected pipeline resource flag");
        }
    }
    return Str;
}